

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

int i4_partition_distinct_count(int n)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 *puVar5;
  int local_28;
  int value;
  int k_sign;
  int k2;
  int k;
  int i;
  int *c;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(n + 1);
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar5 = (undefined4 *)operator_new__(uVar4);
  *puVar5 = 1;
  for (k2 = 1; k2 <= n; k2 = k2 + 1) {
    bVar2 = i4_is_triangular(k2);
    if (bVar2) {
      puVar5[k2] = 1;
    }
    else {
      puVar5[k2] = 0;
    }
    k_sign = 0;
    local_28 = -1;
    while( true ) {
      k_sign = k_sign + 1;
      local_28 = -local_28;
      iVar3 = k_sign * (k_sign * 3 + 1);
      if (k2 < iVar3) break;
      puVar5[k2] = puVar5[k2] + local_28 * puVar5[k2 - iVar3];
    }
    k_sign = 0;
    local_28 = -1;
    while( true ) {
      k_sign = k_sign + 1;
      local_28 = -local_28;
      iVar3 = k_sign * (k_sign * 3 + -1);
      if (k2 < iVar3) break;
      puVar5[k2] = puVar5[k2] + local_28 * puVar5[k2 - iVar3];
    }
  }
  iVar3 = puVar5[n];
  if (puVar5 != (undefined4 *)0x0) {
    operator_delete__(puVar5);
  }
  return iVar3;
}

Assistant:

int i4_partition_distinct_count ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    I4_PARTITION_DISTINCT_COUNT returns any value of Q(N).
//
//  Discussion:
//
//    A partition of an integer N is a representation of the integer
//    as the sum of nonzero positive integers.  The order of the summands
//    does not matter.  The number of partitions of N is symbolized
//    by P(N).  Thus, the number 5 has P(N) = 7, because it has the
//    following partitions:
//
//    5 = 5
//      = 4 + 1
//      = 3 + 2
//      = 3 + 1 + 1
//      = 2 + 2 + 1
//      = 2 + 1 + 1 + 1
//      = 1 + 1 + 1 + 1 + 1
//
//    However, if we require that each member of the partition
//    be distinct, we are computing something symbolized by Q(N).
//    The number 5 has Q(N) = 3, because it has the following partitions
//    into distinct parts:
//
//    5 = 5
//      = 4 + 1
//      = 3 + 2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    22 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the integer to be partitioned.
//
//    Output, int I4_PARTITION_DISTINCT_COUNT, the number of partitions 
//    of the integer into distinct parts.
//
{
  int *c;
  int i;
  int k;
  int k2;
  int k_sign;
  int value;

  c = new int[n+1];

  c[0] = 1;

  for ( i = 1; i <= n; i++ )
  {
    if ( i4_is_triangular ( i ) )
    {
      c[i] = 1;
    }
    else
    {
      c[i] = 0;
    }

    k = 0;
    k_sign = -1;

    for ( ; ; )
    {
      k = k + 1;
      k_sign = -k_sign;
      k2 = k * ( 3 * k + 1 );

      if ( i < k2 )
      {
        break;
      }

      c[i] = c[i] + k_sign * c[i-k2];

    }

    k = 0;
    k_sign = -1;

    for ( ; ; )
    {
      k = k + 1;
      k_sign = -k_sign;
      k2 = k * ( 3 * k - 1 );

      if ( i < k2 )
      {
        break;
      }

      c[i] = c[i] + k_sign * c[i-k2];

    }

  }

  value = c[n];

  delete [] c;

  return value;
}